

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void andps_VW(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  Int32 IVar2;
  bool bVar3;
  
  UVar1 = (pMyDisasm->Reserved_).VEX.state;
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    if (UVar1 != '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      (pMyDisasm->Reserved_).MemDecoration = 0x70;
      (pMyDisasm->Instruction).Category = 0x40003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"andpd",6);
LAB_0011de6d:
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    bVar3 = (pMyDisasm->Reserved_).EVEX.state != '\x01';
    IVar2 = 0x110002;
    if (!bVar3) {
      IVar2 = 0x140002;
    }
    (pMyDisasm->Instruction).Category = IVar2;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vandpd",7);
    if (bVar3) goto LAB_0011ddef;
  }
  else {
    if (UVar1 != '\x01') {
      if (((pMyDisasm->Reserved_).PrefRepe == 1) || ((pMyDisasm->Reserved_).PrefRepne == 1)) {
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
        (pMyDisasm->Operand1).AccessMode = 0;
        (pMyDisasm->Operand2).AccessMode = 0;
        (pMyDisasm->Operand3).AccessMode = 0;
        (pMyDisasm->Operand4).AccessMode = 0;
        (pMyDisasm->Operand5).AccessMode = 0;
        (pMyDisasm->Operand6).AccessMode = 0;
        (pMyDisasm->Operand7).AccessMode = 0;
        (pMyDisasm->Operand8).AccessMode = 0;
        (pMyDisasm->Operand9).AccessMode = 0;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
        return;
      }
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x40003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"andps",6);
      goto LAB_0011de6d;
    }
    bVar3 = (pMyDisasm->Reserved_).EVEX.state == '\x01';
    IVar2 = 0x110002;
    if (bVar3) {
      IVar2 = 0x140002;
    }
    (pMyDisasm->Instruction).Category = IVar2;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vandps",7);
    if (!bVar3) goto LAB_0011ddef;
  }
  (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
LAB_0011ddef:
  if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = 0x40;
  }
  ArgsVEX(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ andps_VW(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {

     if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
      pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vandpd");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
      if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
      ArgsVEX(pMyDisasm);
     }
     else {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       GV.MemDecoration = Arg2_m128d_xmm;
       pMyDisasm->Instruction.Category = SSE_INSTRUCTION+LOGICAL_INSTRUCTION;
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "andpd");
       #endif
       GV.Register_ = SSE_REG;
       GxEx(pMyDisasm);
       pMyDisasm->Operand1.AccessMode = READ + WRITE;

     }
   }
   else {
       if (GV.VEX.state == InUsePrefix) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         pMyDisasm->Instruction.Category += ARITHMETIC_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vandps");
         #endif
         if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
         if (GV.REX.W_ == 0x1) GV.OperandSize = 64;
         ArgsVEX(pMyDisasm);
       }
       else {
         if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
         GV.MemDecoration = Arg2_m128_xmm;
         pMyDisasm->Instruction.Category = SSE_INSTRUCTION+LOGICAL_INSTRUCTION;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "andps");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
}